

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapoke.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint32_t uVar1;
  char cVar2;
  int iVar3;
  nva_regspace_type nVar4;
  nva_err err;
  int *piVar5;
  char *pcVar6;
  uint32_t b;
  uint32_t a;
  nva_regspace rs;
  uint64_t step;
  uint64_t val;
  int local_60;
  uint32_t local_5c;
  nva_regspace local_58;
  long local_40;
  uint64_t local_38;
  
  iVar3 = nva_init();
  if (iVar3 == 0) {
    local_58.card = (nva_card *)0x0;
    local_58.cnum = 0;
    local_58.type = NVA_REGSPACE_BAR0;
    local_58.regsz = 0;
    local_58.idx = 0;
    do {
      while( true ) {
        while (iVar3 = getopt(argc,argv,"c:i:b:t:"), iVar3 < 0x69) {
          if (iVar3 == 0x62) {
            __isoc99_sscanf(_optarg,"%d",&local_58.regsz);
            if ((8 < (uint)local_58.regsz) || ((0x116U >> (local_58.regsz & 0x1fU) & 1) == 0)) {
              main_cold_3();
              return 1;
            }
          }
          else {
            piVar5 = &local_58.cnum;
            if (iVar3 == 99) goto LAB_00102670;
            if (iVar3 == -1) {
              if (nva_cardsnum <= local_58.cnum) {
                if (nva_cardsnum == 0) {
                  main_cold_5();
                  return 1;
                }
                main_cold_4();
                return 1;
              }
              local_58.card = nva_cards[local_58.cnum];
              if (local_58.regsz == 0) {
                iVar3 = nva_rsdefsz(&local_58);
                local_58.regsz = iVar3;
              }
              iVar3 = nva_rsunitsz(&local_58);
              local_60 = local_58.regsz / iVar3;
              local_40 = 0;
              if (argc <= _optind) {
                main_cold_6();
                return 1;
              }
              __isoc99_sscanf(argv[_optind],"%x",&local_5c);
              if (argc <= _optind + 1) {
                main_cold_7();
                return 1;
              }
              pcVar6 = argv[(long)_optind + 1];
              if (_optind + 2 < argc) {
                __isoc99_sscanf(pcVar6,"%x",&local_60);
                pcVar6 = argv[(long)_optind + 2];
              }
              __isoc99_sscanf(pcVar6,"%lx",&local_38);
              if (_optind + 3 < argc) {
                __isoc99_sscanf(argv[(long)_optind + 3],"%lx",&local_40);
              }
              if (local_60 != 0) {
                do {
                  err = nva_wr(&local_58,local_5c,local_38);
                  uVar1 = local_5c;
                  if (err != NVA_ERR_SUCCESS) {
                    cVar2 = nva_rserrc(err);
                    printf("%08x: ERR %c\n",(ulong)uVar1,(ulong)(uint)(int)cVar2);
                  }
                  local_5c = local_5c + local_58.regsz / iVar3;
                  local_38 = local_38 + local_40;
                  local_60 = local_60 - local_58.regsz / iVar3;
                } while (local_60 != 0);
                return 0;
              }
              return 0;
            }
          }
        }
        if (iVar3 == 0x74) break;
        piVar5 = &local_58.idx;
        if (iVar3 == 0x69) {
LAB_00102670:
          __isoc99_sscanf(_optarg,"%d",piVar5);
        }
      }
      nVar4 = nva_rstype(_optarg);
      local_58.type = nVar4;
    } while (nVar4 != NVA_REGSPACE_UNKNOWN);
    main_cold_2();
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	struct nva_regspace rs = { 0 };
	while ((c = getopt (argc, argv, "c:i:b:t:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &rs.cnum);
				break;
			case 'i':
				sscanf(optarg, "%d", &rs.idx);
				break;
			case 'b':
				sscanf(optarg, "%d", &rs.regsz);
				if (rs.regsz != 1 && rs.regsz != 2 && rs.regsz != 4 && rs.regsz != 8) {
					fprintf (stderr, "Invalid size.\n");
					return 1;
				}
				break;
			case 't':
				rs.type = nva_rstype(optarg);
				if (rs.type == NVA_REGSPACE_UNKNOWN) {
					fprintf (stderr, "Unknown register space.\n");
					return 1;
				}
				break;
		}
	if (rs.cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	rs.card = nva_cards[rs.cnum];
	if (rs.regsz == 0)
		rs.regsz = nva_rsdefsz(&rs);
	int unit = nva_rsunitsz(&rs);
	uint32_t a, b = rs.regsz/unit;
	uint64_t val, step = 0;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 >= argc) {
		fprintf (stderr, "No value specified.\n");
		return 1;
	}
	if (optind + 2 >= argc) {
		sscanf (argv[optind + 1], "%"SCNx64, &val);
	} else {
		sscanf (argv[optind + 1], "%x", &b);
		sscanf (argv[optind + 2], "%"SCNx64, &val);
	}
	if (optind + 3 < argc)
		sscanf (argv[optind + 3], "%"SCNx64, &step);
	while (b > 0) {
		int e = nva_wr(&rs, a, val);
		if (e)
			printf("%08x: ERR %c\n", a, nva_rserrc(e));
		a += rs.regsz/unit;
		b -= rs.regsz/unit;
		val += step;
	}
	return 0;
}